

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O1

bool __thiscall S2R2Rect::Contains(S2R2Rect *this,S2Point *p)

{
  double dVar1;
  int b;
  byte bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  S2LogMessage local_20;
  
  dVar4 = ABS(p->c_[0]);
  dVar3 = ABS(p->c_[2]);
  dVar5 = ABS(p->c_[1]);
  b = (dVar5 <= dVar3) + 1;
  if (dVar5 < dVar4) {
    b = (uint)(dVar4 <= dVar3) * 2;
  }
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                    ((BasicVector<Vector3,_double,_3UL> *)p,b);
  bVar2 = 0;
  if (((dVar5 < dVar4) && (bVar2 = 0, dVar3 < dVar4)) && (0.0 <= dVar1)) {
    dVar4 = p->c_[0];
    if (p->c_[2] * (double)0 + p->c_[1] * (double)0 + dVar4 * (double)0x3ff0000000000000 + 0.0 <=
        0.0) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x16d,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: (p.DotProd(GetNorm(face))) > (0) ",0x2f);
      abort();
    }
    dVar5 = p->c_[1] / dVar4;
    dVar4 = p->c_[2] / dVar4;
    dVar3 = dVar5 * 3.0;
    if (0.0 <= dVar5) {
      dVar3 = dVar3 + 1.0;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = dVar3 * 0.5;
    }
    else {
      dVar3 = 1.0 - dVar3;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = dVar3 * -0.5 + 1.0;
    }
    dVar5 = dVar4 * 3.0;
    if (0.0 <= dVar4) {
      dVar5 = dVar5 + 1.0;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = dVar5 * 0.5;
    }
    else {
      dVar5 = 1.0 - dVar5;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = dVar5 * -0.5 + 1.0;
    }
    bVar2 = 0;
    if (((this->rect_).bounds_[0].bounds_.c_[0] <= dVar3) &&
       (dVar3 <= (this->rect_).bounds_[0].bounds_.c_[1])) {
      bVar2 = -(dVar5 <= (this->rect_).bounds_[1].bounds_.c_[1]) &
              -((this->rect_).bounds_[1].bounds_.c_[0] <= dVar5);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool S2R2Rect::Contains(const S2Point& p) const {
  if (S2::GetFace(p) != 0) return false;
  double u, v;
  S2::ValidFaceXYZtoUV(0, p, &u, &v);
  return Contains(R2Point(S2::UVtoST(u), S2::UVtoST(v)));
}